

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

Var Js::JavascriptSet::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  Type TVar3;
  bool bVar4;
  int n;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  void **ppvVar10;
  JavascriptMethod p_Var11;
  JavascriptLibrary *pJVar12;
  MapOrSetDataNode<void_*> *local_158;
  JavascriptSet *local_120;
  CallInfo local_e8;
  CallInfo local_e0;
  undefined1 local_d8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var value;
  Iterator iterator;
  Var thisArg;
  RecyclableObject *callBackFn;
  JavascriptSet *set;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x9e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)function_local,
             L"Set.prototype.forEach",&stack0x00000000);
  callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar4 = VarIs<Js::JavascriptSet>((Var)callInfo_local);
  if (bVar4) {
    local_120 = UnsafeVarTo<Js::JavascriptSet>((Var)callInfo_local);
  }
  else {
    local_120 = (JavascriptSet *)0x0;
  }
  if (local_120 != (JavascriptSet *)0x0) {
    if (1 < ((uint)scriptContext & 0xffffff)) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      bVar4 = JavascriptConversion::IsCallable(pvVar8);
      if (bVar4) {
        pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
        pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
        if (((uint)scriptContext & 0xffffff) < 3) {
          pJVar12 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
          local_158 = (MapOrSetDataNode<void_*> *)
                      JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
        }
        else {
          local_158 = (MapOrSetDataNode<void_*> *)
                      Arguments::operator[]((Arguments *)&scriptContext,2);
        }
        iterator.current.ptr = local_158;
        GetIterator((JavascriptSet *)&value);
        while (bVar4 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&value), bVar4) {
          ppvVar10 = MapOrSetDataList<void_*>::Iterator::Current((Iterator *)&value);
          autoReentrancyHandler._8_8_ = *ppvVar10;
          pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d8,pTVar6);
          pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
          pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
          ThreadContext::AssertJsReentrancy(pTVar6);
          p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
          CheckIsExecutable(pRVar9,p_Var11);
          p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
          CallInfo::CallInfo(&local_e0,CallFlags_Value,4);
          CallInfo::CallInfo(&local_e8,CallFlags_Value,4);
          TVar3 = iterator.current;
          uVar2 = autoReentrancyHandler._8_8_;
          pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
          (*p_Var11)(pRVar9,(CallInfo)pRVar9,local_e0,0,0,0,0,local_e8,TVar3.ptr,uVar2,uVar2,pvVar8)
          ;
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d8);
        }
        pJVar12 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
        pRVar9 = JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80)
        ;
        return pRVar9;
      }
    }
    JavascriptError::ThrowTypeError
              ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"Set.prototype.forEach");
  }
  JavascriptError::ThrowTypeErrorVar
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec04,L"Set.prototype.forEach",L"Set");
}

Assistant:

Var JavascriptSet::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Set.prototype.forEach"));

    JavascriptSet* set = JavascriptOperators::TryFromVar<JavascriptSet>(args[0]);
    if (set == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Set.prototype.forEach"), _u("Set"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Set.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = set->GetIterator();

    while (iterator.Next())
    {
        Var value = iterator.Current();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, value, args[0]);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}